

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableInit *curr)

{
  Type TVar1;
  bool bVar2;
  uint uVar3;
  ExpressionRunner<wasm::ModuleRunner> *pEVar4;
  ElementSegment *pEVar5;
  Literal *pLVar6;
  uint64_t a;
  address64_t aVar7;
  address64_t aVar8;
  size_type sVar9;
  size_type sVar10;
  ExternalInterface *pEVar11;
  reference ppEVar12;
  Address local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  Flow local_1f0;
  undefined1 local_1a8 [8];
  Literal value;
  size_t i;
  Index tableSize;
  undefined1 local_158 [8];
  TableInstanceInfo info;
  Address sizeVal;
  Address offsetVal;
  Address destVal;
  ElementSegment *segment;
  Flow size;
  Flow offset;
  undefined1 local_68 [8];
  Flow dest;
  TableInit *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  dest.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar4,*(Expression **)(dest.breakTo.super_IString.str._M_str + 0x20))
  ;
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar4,
               *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x28));
    bVar2 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&segment,pEVar4,
                 *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x30));
      bVar2 = Flow::breaking((Flow *)&segment);
      if (bVar2) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&segment);
      }
      else {
        pEVar5 = Module::getElementSegment
                           (this->wasm,
                            (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x10))->str);
        pLVar6 = Flow::getSingleValue((Flow *)local_68);
        a = wasm::Literal::getUnsigned(pLVar6);
        wasm::Address::Address(&offsetVal,a);
        pLVar6 = Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
        uVar3 = wasm::Literal::geti32(pLVar6);
        wasm::Address::Address(&sizeVal,(ulong)uVar3);
        pLVar6 = Flow::getSingleValue((Flow *)&segment);
        uVar3 = wasm::Literal::geti32(pLVar6);
        wasm::Address::Address((Address *)&info.name.super_IString.str._M_str,(ulong)uVar3);
        aVar7 = wasm::Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar8 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        if (aVar7 + aVar8 != 0) {
          sVar9 = std::
                  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  ::count(&this->droppedElementSegments,
                          (key_type *)(dest.breakTo.super_IString.str._M_str + 0x10));
          if (sVar9 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in table.init");
          }
        }
        aVar7 = wasm::Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar8 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        sVar10 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                           (&pEVar5->data);
        if (sVar10 < aVar7 + aVar8) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in table.init");
        }
        getTableInstanceInfo
                  ((TableInstanceInfo *)local_158,this,
                   (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x38))->str);
        pEVar11 = TableInstanceInfo::interface((TableInstanceInfo *)local_158);
        uVar3 = (*pEVar11->_vptr_ExternalInterface[0x1b])
                          (pEVar11,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                           CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                    (undefined4)info.name.super_IString.str._M_len));
        aVar7 = wasm::Address::operator_cast_to_unsigned_long(&offsetVal);
        aVar8 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        if ((ulong)uVar3 < aVar7 + aVar8) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds table access in table.init");
        }
        value.type.id = 0;
        while( true ) {
          TVar1.id = value.type.id;
          aVar7 = wasm::Address::operator_cast_to_unsigned_long
                            ((Address *)&info.name.super_IString.str._M_str);
          if (aVar7 <= TVar1.id) break;
          pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
          aVar7 = wasm::Address::operator_cast_to_unsigned_long(&sizeVal);
          ppEVar12 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                     operator[](&pEVar5->data,aVar7 + value.type.id);
          ExpressionRunner<wasm::ModuleRunner>::visit(&local_1f0,pEVar4,*ppEVar12);
          pLVar6 = Flow::getSingleValue(&local_1f0);
          wasm::Literal::Literal((Literal *)local_1a8,pLVar6);
          Flow::~Flow(&local_1f0);
          pEVar11 = TableInstanceInfo::interface((TableInstanceInfo *)local_158);
          local_208 = CONCAT44(info.instance._4_4_,info.instance._0_4_);
          uStack_200 = CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                (undefined4)info.name.super_IString.str._M_len);
          aVar7 = wasm::Address::operator_cast_to_unsigned_long(&offsetVal);
          wasm::Address::Address(&local_210,aVar7 + value.type.id);
          (*pEVar11->_vptr_ExternalInterface[0x1c])
                    (pEVar11,local_208,uStack_200,local_210.addr,local_1a8);
          wasm::Literal::~Literal((Literal *)local_1a8);
          value.type.id = value.type.id + 1;
        }
        Flow::Flow(__return_storage_ptr__);
      }
      Flow::~Flow((Flow *)&segment);
    }
    Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableInit(TableInit* curr) {
    NOTE_ENTER("TableInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getElementSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(uint32_t(offset.getSingleValue().geti32()));
    Address sizeVal(uint32_t(size.getSingleValue().geti32()));

    if (offsetVal + sizeVal > 0 &&
        droppedElementSegments.count(curr->segment)) {
      trap("out of bounds segment access in table.init");
    }
    if (offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in table.init");
    }
    auto info = getTableInstanceInfo(curr->table);
    auto tableSize = info.interface()->tableSize(info.name);
    if (destVal + sizeVal > tableSize) {
      trap("out of bounds table access in table.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      // FIXME: We should not call visit() here more than once at runtime. The
      //        values in the segment should be computed once during startup,
      //        and then read here as needed. For example, if we had a
      //        struct.new here then we should not allocate a new struct each
      //        time we table.init that data.
      auto value = self()->visit(segment->data[offsetVal + i]).getSingleValue();
      info.interface()->tableStore(info.name, destVal + i, value);
    }
    return {};
  }